

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall SimpleStringBuffer::add(SimpleStringBuffer *this,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int count;
  va_list arguments;
  size_t positions_left;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  __va_list_tag local_38;
  long local_18;
  char *local_10;
  long local_8;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_18 = *(long *)(in_RDI + 0x1008) - *(long *)(in_RDI + 0x1000);
  if (local_18 != 0) {
    local_38.reg_save_area = local_f8;
    local_38.overflow_arg_area = &stack0x00000008;
    local_38.fp_offset = 0x30;
    local_38.gp_offset = 0x10;
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_10 = in_RSI;
    local_8 = in_RDI;
    iVar1 = (*PlatformSpecificVSNprintf)
                      ((char *)(in_RDI + *(long *)(in_RDI + 0x1000)),local_18 + 1,in_RSI,&local_38);
    if (0 < iVar1) {
      *(long *)(in_RDI + 0x1000) = (long)iVar1 + *(long *)(in_RDI + 0x1000);
    }
    if (*(ulong *)(in_RDI + 0x1008) < *(ulong *)(in_RDI + 0x1000)) {
      *(undefined8 *)(in_RDI + 0x1000) = *(undefined8 *)(in_RDI + 0x1008);
    }
  }
  return;
}

Assistant:

void SimpleStringBuffer::add(const char* format, ...)
{
    const size_t positions_left = write_limit_ - positions_filled_;
    if (positions_left == 0) return;

    va_list arguments;
    va_start(arguments, format);
    const int count = PlatformSpecificVSNprintf(buffer_ + positions_filled_, positions_left+1, format, arguments);
    if (count > 0) positions_filled_ += (size_t) count;
    if (positions_filled_ > write_limit_) positions_filled_ = write_limit_;
    va_end(arguments);
}